

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O1

string * __thiscall
bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
          (string *__return_storage_ptr__,HexEncoder *this,uchar *bytes,int offset,
          size_t len_to_read,size_t len_of_bytes)

{
  HexEncoder HVar1;
  string *psVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  ulong uVar4;
  stringstream ss;
  char local_1c9;
  string *local_1c8;
  HexEncoder *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  local_1c0 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar3 = (ulong)(int)bytes;
  uVar4 = CONCAT44(in_register_0000000c,offset) + uVar3;
  if (len_to_read <= uVar4) {
    uVar4 = len_to_read;
  }
  if (uVar3 < uVar4) {
    do {
      HVar1 = local_1c0[uVar3];
      local_1c9 = *(char *)(HEX_CHARS + (ulong)((byte)HVar1 >> 4));
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c9,1);
      local_1c9 = *(char *)(HEX_CHARS + (ulong)((byte)HVar1 & 0xf));
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c9,1);
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar4);
  }
  psVar2 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string HexEncoder::EncodeAsHex(unsigned char* bytes, int offset, size_t len_to_read, size_t len_of_bytes)
{
    std::stringstream ss;

    for (int index = offset; index < offset + len_to_read && index < len_of_bytes; ++index)
    {
        unsigned int byte = (unsigned int) bytes[index];

        ss << HEX_CHARS[byte >> 4u & 0xfu];
        ss << HEX_CHARS[byte & 0xfu];
    }

    return ss.str();
}